

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMCDATASectionImpl.cpp
# Opt level: O0

DOMText * __thiscall
xercesc_4_0::DOMCDATASectionImpl::splitText(DOMCDATASectionImpl *this,XMLSize_t offset)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  XMLSize_t XVar3;
  DOMException *pDVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  DOMNode *startNode;
  long *plVar5;
  BaseRefVectorOf<xercesc_4_0::DOMRangeImpl> *this_00;
  DOMRangeImpl *this_01;
  long *local_f8;
  MemoryManager *local_e8;
  DOMDocumentImpl *local_d8;
  long local_c8;
  MemoryManager *local_b8;
  MemoryManager *local_a8;
  DOMDocumentImpl *local_98;
  long local_88;
  MemoryManager *local_78;
  ulong local_60;
  XMLSize_t i;
  XMLSize_t sz;
  Ranges *ranges;
  DOMNode *parent;
  DOMText *newText;
  DOMDocumentImpl *doc;
  XMLSize_t len;
  XMLSize_t offset_local;
  DOMCDATASectionImpl *this_local;
  undefined4 extraout_var_04;
  
  bVar1 = DOMNodeImpl::isReadOnly(&this->fNode);
  if (bVar1) {
    pDVar4 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this == (DOMCDATASectionImpl *)0x0) {
      local_78 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar2 = (*(this->super_DOMCDATASection).super_DOMText.super_DOMCharacterData.super_DOMNode.
                _vptr_DOMNode[0xc])();
      if (CONCAT44(extraout_var,iVar2) == 0) {
        local_88 = 0;
      }
      else {
        local_88 = CONCAT44(extraout_var,iVar2) + -8;
      }
      if (local_88 == 0) {
        local_a8 = XMLPlatformUtils::fgMemoryManager;
      }
      else {
        iVar2 = (*(this->super_DOMCDATASection).super_DOMText.super_DOMCharacterData.super_DOMNode.
                  _vptr_DOMNode[0xc])();
        if (CONCAT44(extraout_var_00,iVar2) == 0) {
          local_98 = (DOMDocumentImpl *)0x0;
        }
        else {
          local_98 = (DOMDocumentImpl *)(CONCAT44(extraout_var_00,iVar2) + -8);
        }
        local_a8 = DOMDocumentImpl::getMemoryManager(local_98);
      }
      local_78 = local_a8;
    }
    DOMException::DOMException(pDVar4,7,0,local_78);
    __cxa_throw(pDVar4,&DOMException::typeinfo,DOMException::~DOMException);
  }
  XVar3 = DOMBuffer::getLen((this->fCharacterData).fDataBuf);
  if (offset <= XVar3) {
    iVar2 = (*(this->super_DOMCDATASection).super_DOMText.super_DOMCharacterData.super_DOMNode.
              _vptr_DOMNode[0xc])();
    if (CONCAT44(extraout_var_03,iVar2) == 0) {
      local_f8 = (long *)0x0;
    }
    else {
      local_f8 = (long *)(CONCAT44(extraout_var_03,iVar2) + -8);
    }
    iVar2 = (*(this->super_DOMCDATASection).super_DOMText.super_DOMCharacterData.super_DOMNode.
              _vptr_DOMNode[0x2a])(this,offset,XVar3 - offset);
    startNode = (DOMNode *)(**(code **)(*local_f8 + 0x198))(local_f8,iVar2);
    iVar2 = (*(this->super_DOMCDATASection).super_DOMText.super_DOMCharacterData.super_DOMNode.
              _vptr_DOMNode[5])();
    plVar5 = (long *)CONCAT44(extraout_var_04,iVar2);
    if (plVar5 != (long *)0x0) {
      iVar2 = (*(this->super_DOMCDATASection).super_DOMText.super_DOMCharacterData.super_DOMNode.
                _vptr_DOMNode[10])();
      (**(code **)(*plVar5 + 0x70))(plVar5,startNode,iVar2);
    }
    DOMBuffer::chop((this->fCharacterData).fDataBuf,offset);
    if (((local_f8 != (long *)0x0) &&
        (this_00 = (BaseRefVectorOf<xercesc_4_0::DOMRangeImpl> *)(**(code **)(*local_f8 + 0x230))(),
        this_00 != (BaseRefVectorOf<xercesc_4_0::DOMRangeImpl> *)0x0)) &&
       (XVar3 = BaseRefVectorOf<xercesc_4_0::DOMRangeImpl>::size(this_00), XVar3 != 0)) {
      for (local_60 = 0; local_60 < XVar3; local_60 = local_60 + 1) {
        this_01 = BaseRefVectorOf<xercesc_4_0::DOMRangeImpl>::elementAt(this_00,local_60);
        DOMRangeImpl::updateSplitInfo(this_01,(DOMNode *)this,startNode,offset);
      }
    }
    return (DOMText *)startNode;
  }
  pDVar4 = (DOMException *)__cxa_allocate_exception(0x28);
  if (this == (DOMCDATASectionImpl *)0x0) {
    local_b8 = XMLPlatformUtils::fgMemoryManager;
  }
  else {
    iVar2 = (*(this->super_DOMCDATASection).super_DOMText.super_DOMCharacterData.super_DOMNode.
              _vptr_DOMNode[0xc])();
    if (CONCAT44(extraout_var_01,iVar2) == 0) {
      local_c8 = 0;
    }
    else {
      local_c8 = CONCAT44(extraout_var_01,iVar2) + -8;
    }
    if (local_c8 == 0) {
      local_e8 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar2 = (*(this->super_DOMCDATASection).super_DOMText.super_DOMCharacterData.super_DOMNode.
                _vptr_DOMNode[0xc])();
      if (CONCAT44(extraout_var_02,iVar2) == 0) {
        local_d8 = (DOMDocumentImpl *)0x0;
      }
      else {
        local_d8 = (DOMDocumentImpl *)(CONCAT44(extraout_var_02,iVar2) + -8);
      }
      local_e8 = DOMDocumentImpl::getMemoryManager(local_d8);
    }
    local_b8 = local_e8;
  }
  DOMException::DOMException(pDVar4,1,0,local_b8);
  __cxa_throw(pDVar4,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

DOMText *DOMCDATASectionImpl::splitText(XMLSize_t offset)
{
    if (fNode.isReadOnly())
    {
        throw DOMException(DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMNodeMemoryManager);
    }
    XMLSize_t len = fCharacterData.fDataBuf->getLen();
    if (offset > len)
        throw DOMException(DOMException::INDEX_SIZE_ERR, 0, GetDOMNodeMemoryManager);

    DOMDocumentImpl *doc = (DOMDocumentImpl *)getOwnerDocument();
    DOMText *newText =
      doc->createCDATASection(this->substringData(offset, len - offset));

    DOMNode *parent = getParentNode();
    if (parent != 0)
        parent->insertBefore(newText, getNextSibling());

    fCharacterData.fDataBuf->chop(offset);

    if (doc != 0) {
        Ranges* ranges = doc->getRanges();
        if (ranges != 0) {
            XMLSize_t sz = ranges->size();
            if (sz != 0) {
                for (XMLSize_t i =0; i<sz; i++) {
                    ranges->elementAt(i)->updateSplitInfo( this, newText, offset);
                }
            }
        }
    }

    return newText;
}